

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

auto_ptr<cmFunctionBlocker> __thiscall
cmMakefile::RemoveFunctionBlocker(cmMakefile *this,cmFunctionBlocker *fb,cmListFileFunction *lff)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  reference ppcVar4;
  cmListFileContext *lfc_00;
  ostream *poVar5;
  cmListFileContext *in_RCX;
  auto_ptr<cmFunctionBlocker> local_230;
  cmFunctionBlocker *local_228;
  auto_ptr<cmFunctionBlocker> local_220;
  cmFunctionBlocker *local_218;
  cmFunctionBlocker **local_210;
  const_iterator local_208;
  cmFunctionBlocker *local_200;
  cmFunctionBlocker *b;
  ostringstream local_1c8 [8];
  ostringstream e;
  cmListFileContext *lfc;
  __normal_iterator<cmFunctionBlocker_**,_std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>_>
  local_40;
  iterator pos;
  size_type i;
  size_type barrier;
  cmListFileFunction *lff_local;
  cmFunctionBlocker *fb_local;
  cmMakefile *this_local;
  
  i = 0;
  bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     ((long)&fb[10].StartingContext.FilePath.field_2 + 8));
  if (!bVar1) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        ((long)&fb[10].StartingContext.FilePath.field_2 + 8));
    i = *pvVar3;
  }
  pos._M_current =
       (cmFunctionBlocker **)
       std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::size
                 ((vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_> *)
                  &fb[10].StartingContext.FilePath);
  while( true ) {
    if (pos._M_current <= i) {
      cmsys::auto_ptr<cmFunctionBlocker>::auto_ptr(&local_230,(cmFunctionBlocker *)0x0);
      local_228 = (cmFunctionBlocker *)
                  cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_230);
      cmsys::auto_ptr<cmFunctionBlocker>::auto_ptr
                ((auto_ptr<cmFunctionBlocker> *)this,(auto_ptr_ref<cmFunctionBlocker>)local_228);
      cmsys::auto_ptr<cmFunctionBlocker>::~auto_ptr(&local_230);
      return (auto_ptr<cmFunctionBlocker>)(cmFunctionBlocker *)this;
    }
    lfc = (cmListFileContext *)
          std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::begin
                    ((vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_> *)
                     &fb[10].StartingContext.FilePath);
    local_40 = __gnu_cxx::
               __normal_iterator<cmFunctionBlocker_**,_std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>_>
               ::operator+((__normal_iterator<cmFunctionBlocker_**,_std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>_>
                            *)&lfc,(long)pos._M_current + -1);
    ppcVar4 = __gnu_cxx::
              __normal_iterator<cmFunctionBlocker_**,_std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>_>
              ::operator*(&local_40);
    if ((cmListFileFunction *)*ppcVar4 == lff) break;
    pos._M_current = pos._M_current + -1;
  }
  ppcVar4 = __gnu_cxx::
            __normal_iterator<cmFunctionBlocker_**,_std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>_>
            ::operator*(&local_40);
  uVar2 = (*(*ppcVar4)->_vptr_cmFunctionBlocker[1])(*ppcVar4,in_RCX,fb);
  if ((uVar2 & 1) == 0) {
    lfc_00 = cmFunctionBlocker::GetStartingContext((cmFunctionBlocker *)lff);
    std::__cxx11::ostringstream::ostringstream(local_1c8);
    poVar5 = std::operator<<((ostream *)local_1c8,"A logical block opening on the line\n");
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = ::operator<<(poVar5,lfc_00);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"closes on the line\n");
    poVar5 = std::operator<<(poVar5,"  ");
    poVar5 = ::operator<<(poVar5,in_RCX);
    poVar5 = std::operator<<(poVar5,"\n");
    std::operator<<(poVar5,"with mis-matching arguments.");
    std::__cxx11::ostringstream::str();
    IssueMessage((cmMakefile *)fb,AUTHOR_WARNING,(string *)&b);
    std::__cxx11::string::~string((string *)&b);
    std::__cxx11::ostringstream::~ostringstream(local_1c8);
  }
  ppcVar4 = __gnu_cxx::
            __normal_iterator<cmFunctionBlocker_**,_std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>_>
            ::operator*(&local_40);
  local_200 = *ppcVar4;
  __gnu_cxx::
  __normal_iterator<cmFunctionBlocker*const*,std::vector<cmFunctionBlocker*,std::allocator<cmFunctionBlocker*>>>
  ::__normal_iterator<cmFunctionBlocker**>
            ((__normal_iterator<cmFunctionBlocker*const*,std::vector<cmFunctionBlocker*,std::allocator<cmFunctionBlocker*>>>
              *)&local_208,&local_40);
  local_210 = (cmFunctionBlocker **)
              std::vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>::erase
                        ((vector<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_> *)
                         &fb[10].StartingContext.FilePath,local_208);
  cmsys::auto_ptr<cmFunctionBlocker>::auto_ptr(&local_220,local_200);
  local_218 = (cmFunctionBlocker *)
              cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_220);
  cmsys::auto_ptr<cmFunctionBlocker>::auto_ptr
            ((auto_ptr<cmFunctionBlocker> *)this,(auto_ptr_ref<cmFunctionBlocker>)local_218);
  cmsys::auto_ptr<cmFunctionBlocker>::~auto_ptr(&local_220);
  return (auto_ptr<cmFunctionBlocker>)(cmFunctionBlocker *)this;
}

Assistant:

cmsys::auto_ptr<cmFunctionBlocker>
cmMakefile::RemoveFunctionBlocker(cmFunctionBlocker* fb,
                                  const cmListFileFunction& lff)
{
  // Find the function blocker stack barrier for the current scope.
  // We only remove a blocker whose index is not less than the barrier.
  FunctionBlockersType::size_type barrier = 0;
  if(!this->FunctionBlockerBarriers.empty())
    {
    barrier = this->FunctionBlockerBarriers.back();
    }

  // Search for the function blocker whose scope this command ends.
  for(FunctionBlockersType::size_type
        i = this->FunctionBlockers.size(); i > barrier; --i)
    {
    std::vector<cmFunctionBlocker*>::iterator pos =
      this->FunctionBlockers.begin() + (i - 1);
    if (*pos == fb)
      {
      // Warn if the arguments do not match, but always remove.
      if(!(*pos)->ShouldRemove(lff, *this))
        {
        cmListFileContext const& lfc = fb->GetStartingContext();
        std::ostringstream e;
        e << "A logical block opening on the line\n"
          << "  " << lfc << "\n"
          << "closes on the line\n"
          << "  " << lff << "\n"
          << "with mis-matching arguments.";
        this->IssueMessage(cmake::AUTHOR_WARNING, e.str());
        }
      cmFunctionBlocker* b = *pos;
      this->FunctionBlockers.erase(pos);
      return cmsys::auto_ptr<cmFunctionBlocker>(b);
      }
    }

  return cmsys::auto_ptr<cmFunctionBlocker>();
}